

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall Assimp::SMDImporter::CreateOutputNodes(SMDImporter *this)

{
  pointer pBVar1;
  aiScene *paVar2;
  aiNode *paVar3;
  Bone *bone;
  pointer pBVar4;
  
  paVar3 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar3);
  this->pScene->mRootNode = paVar3;
  AddBoneChildren(this,this->pScene->mRootNode,0xffffffff);
  pBVar1 = (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pBVar4 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar4 != pBVar1; pBVar4 = pBVar4 + 1) {
    aiMatrix4x4t<float>::Inverse(&pBVar4->mOffsetMatrix);
  }
  paVar2 = this->pScene;
  if (((paVar2->mFlags & 1) == 0) || (paVar3 = paVar2->mRootNode, paVar3->mNumChildren != 1)) {
    builtin_strncpy((paVar2->mRootNode->mName).data,"<SMD_root>",0xb);
    (this->pScene->mRootNode->mName).length = 10;
  }
  else {
    paVar2->mRootNode = *paVar3->mChildren;
    *paVar3->mChildren = (aiNode *)0x0;
    if (paVar3 != (aiNode *)0x0) {
      aiNode::~aiNode(paVar3);
      operator_delete(paVar3,0x478);
    }
    this->pScene->mRootNode->mParent = (aiNode *)0x0;
  }
  return;
}

Assistant:

void SMDImporter::CreateOutputNodes() {
    pScene->mRootNode = new aiNode();

    // now add all bones as dummy sub nodes to the graph
    AddBoneChildren(pScene->mRootNode,(uint32_t)-1);
    for (auto &bone : asBones) {
        bone.mOffsetMatrix.Inverse();
    }

    // if we have only one bone we can even remove the root node
    if (pScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE && 1 == pScene->mRootNode->mNumChildren) {
        aiNode* pcOldRoot = pScene->mRootNode;
        pScene->mRootNode = pcOldRoot->mChildren[0];
        pcOldRoot->mChildren[0] = nullptr;
        delete pcOldRoot;

        pScene->mRootNode->mParent = nullptr;
    }
    else
    {
        ::strcpy(pScene->mRootNode->mName.data, "<SMD_root>");
        pScene->mRootNode->mName.length = 10;
    }
}